

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

uc_err uc_gen_tb(uc_struct_conflict15 *uc,uint64_t addr,uc_tb *out_tb)

{
  uint uVar1;
  uint cf_mask;
  uint32_t uVar2;
  ulong uVar3;
  bool bVar4;
  uint local_54;
  uint32_t cflags;
  uint32_t hash;
  uint32_t flags;
  CPUArchState_conflict28 *env;
  CPUState *cpu;
  target_ulong_conflict pc;
  target_ulong_conflict cs_base;
  TranslationBlock_conflict *tb;
  uc_tb *out_tb_local;
  uint64_t addr_local;
  uc_struct_conflict15 *uc_local;
  
  env = (CPUArchState_conflict28 *)uc->cpu;
  _hash = (CPUTriCoreState *)((CPUState *)env)->env_ptr;
  local_54 = ((CPUState *)env)->cflags_next_tb;
  tb = (TranslationBlock_conflict *)out_tb;
  out_tb_local = (uc_tb *)addr;
  addr_local = (uint64_t)uc;
  if (local_54 == 0xffffffff) {
    local_54 = curr_cflags();
  }
  cpu_get_tb_cpu_state
            (_hash,(target_ulong_conflict *)&cpu,(target_ulong_conflict *)((long)&cpu + 4),&cflags);
  cpu._0_4_ = (target_ulong_conflict)out_tb_local;
  uVar1 = tb_jmp_cache_hash_func(_hash->uc,(target_ulong_conflict)cpu);
  _pc = *(TranslationBlock **)(&env->DPR3_2L + (ulong)uVar1 * 2);
  cf_mask = env[0x2e].gpr_a[0xd] << 0x18 | local_54 & 0xffffff;
  bVar4 = false;
  if ((((_pc != (TranslationBlock *)0x0) &&
       (bVar4 = false, (target_ulong_conflict)_pc->pc == (target_ulong_conflict)cpu)) &&
      (bVar4 = false, *(target_ulong_conflict *)((long)&_pc->pc + 4) == cpu._4_4_)) &&
     ((bVar4 = false, (uint32_t)_pc->cs_base == cflags &&
      (bVar4 = false, (ulong)*(uint *)&_pc->size == *(ulong *)(env[0x2e].gpr_a + 10))))) {
    uVar2 = tb_cflags((TranslationBlock_conflict *)_pc);
    bVar4 = (uVar2 & 0xff0effff) == cf_mask;
  }
  if (!bVar4) {
    _pc = tb_htable_lookup_tricore
                    ((CPUState *)env,(ulong)(target_ulong_conflict)cpu,(ulong)cpu._4_4_,cflags,
                     cf_mask);
    *(TranslationBlock **)(&env->DPR3_2L + (ulong)uVar1 * 2) = _pc;
    if (_pc == (TranslationBlock *)0x0) {
      mmap_lock();
      _pc = (TranslationBlock *)
            tb_gen_code_tricore((CPUState *)env,(target_ulong_conflict)cpu,cpu._4_4_,cflags,cf_mask)
      ;
      mmap_unlock();
      *(TranslationBlock **)(&env->DPR3_2L + (ulong)uVar1 * 2) = _pc;
    }
  }
  if (_pc == (TranslationBlock *)0x0) {
    uc_local._4_4_ = UC_ERR_NOMEM;
  }
  else {
    if (tb != (TranslationBlock_conflict *)0x0) {
      uVar3 = (ulong)(uint)_pc->pc;
      tb->pc = (int)uVar3;
      tb->cs_base = (int)(uVar3 >> 0x20);
      *(uint16_t *)&tb->flags = *(uint16_t *)((long)&_pc->cs_base + 6);
      *(uint16_t *)((long)&tb->flags + 2) = *(uint16_t *)((long)&_pc->cs_base + 4);
    }
    uc_local._4_4_ = UC_ERR_OK;
  }
  return uc_local._4_4_;
}

Assistant:

static uc_err uc_gen_tb(struct uc_struct *uc, uint64_t addr, uc_tb *out_tb) 
{
    TranslationBlock *tb;
    target_ulong cs_base, pc;
    CPUState *cpu = uc->cpu;
    CPUArchState *env = (CPUArchState *)cpu->env_ptr;
    uint32_t flags;
    uint32_t hash;
    uint32_t cflags = cpu->cflags_next_tb;

    if (cflags == -1) {
        cflags = curr_cflags();
    }

    cpu_get_tb_cpu_state(env, &pc, &cs_base, &flags);

    // Unicorn: Our hack here.
    pc = addr;

    hash = tb_jmp_cache_hash_func(env->uc, pc);
    tb = cpu->tb_jmp_cache[hash];

    cflags &= ~CF_CLUSTER_MASK;
    cflags |= ((uint32_t)cpu->cluster_index) << CF_CLUSTER_SHIFT;

    if (unlikely(!(tb &&
                   tb->pc == pc &&
                   tb->cs_base == cs_base &&
                   tb->flags == flags &&
                   tb->trace_vcpu_dstate == *cpu->trace_dstate &&
                   (tb_cflags(tb) & (CF_HASH_MASK | CF_INVALID)) == cflags))) {

        tb = tb_htable_lookup(cpu, pc, cs_base, flags, cflags);
        cpu->tb_jmp_cache[hash] = tb;

        if (tb == NULL) {
            mmap_lock();
            tb = tb_gen_code(cpu, pc, cs_base, flags, cflags);
            mmap_unlock();
            /* We add the TB in the virtual pc hash table for the fast lookup */
            cpu->tb_jmp_cache[hash] = tb;
        }
    }

    // If we still couldn't generate a TB, it must be out of memory.
    if (tb == NULL) {
        return UC_ERR_NOMEM;
    }

    if (out_tb != NULL) {
        UC_TB_COPY(out_tb, tb);
    }

    return UC_ERR_OK;
}